

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

int __thiscall ON_BinaryArchive::Read3dmV1Material(ON_BinaryArchive *this,ON_Material **ppMaterial)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  ON_3DM_BIG_CHUNK *pOVar4;
  ON_Material *this_00;
  int iVar5;
  ON_3DM_BIG_CHUNK *pOVar6;
  bool bHaveMat;
  ON__UINT32 tc;
  uint local_194;
  ON__UINT64 local_190;
  ON_3dPoint pt;
  ON__INT64 local_170;
  ON_Material material;
  
  ON_Material::ON_Material(&material);
  iVar5 = 0;
  do {
    if (iVar5 != 0) {
LAB_003d36fb:
      iVar5 = -1;
      goto LAB_003d3733;
    }
    local_194 = 0;
    bHaveMat = false;
    local_170 = 0;
    bVar2 = BeginRead3dmBigChunk(this,&local_194,&local_170);
    if (!bVar2) {
      iVar5 = 0;
      goto LAB_003d3733;
    }
    if ((local_194 - 0x20008 < 4) && (local_194 - 0x20008 != 2)) {
      tc = 0;
      pt.x = 0.0;
      bVar2 = PeekAt3dmBigChunkType(this,&tc,(ON__INT64 *)&pt);
      iVar5 = 0;
      if (((!bVar2 || tc != 0x2fffe) ||
          (bVar2 = BeginRead3dmBigChunk(this,&tc,(ON__INT64 *)&pt), !bVar2)) ||
         (bVar2 = EndRead3dmChunk(this), !bVar2)) goto LAB_003d3603;
      bVar2 = Read3dmV1AttributesOrMaterial
                        (this,(ON_3dmObjectAttributes *)0x0,&material,&bHaveMat,0x2ffff,
                         (ON__3dmV1_XDATA *)0x0);
LAB_003d35fe:
      iVar5 = bVar2 - 1;
    }
    else {
      if (local_194 == 0x10003) {
        bVar2 = Read3dmV1AttributesOrMaterial
                          (this,(ON_3dmObjectAttributes *)0x0,&material,&bHaveMat,0x10103,
                           (ON__3dmV1_XDATA *)0x0);
        goto LAB_003d35fe;
      }
      if (local_194 == 0x10004) {
        bVar2 = Read3dmV1AttributesOrMaterial
                          (this,(ON_3dmObjectAttributes *)0x0,&material,&bHaveMat,0x10104,
                           (ON__3dmV1_XDATA *)0x0);
        goto LAB_003d35fe;
      }
      if (local_194 == 0x10008) {
        bVar2 = Read3dmV1AttributesOrMaterial
                          (this,(ON_3dmObjectAttributes *)0x0,&material,&bHaveMat,0x10108,
                           (ON__3dmV1_XDATA *)0x0);
        goto LAB_003d35fe;
      }
      if (local_194 == 0x100015) {
        tc = 0;
        pt.x = 0.0;
        bVar2 = PeekAt3dmBigChunkType(this,&tc,(ON__INT64 *)&pt);
        iVar5 = 0;
        if (((bVar2 && tc == 0x100017) &&
            (bVar2 = BeginRead3dmBigChunk(this,&tc,(ON__INT64 *)&pt), bVar2)) &&
           (bVar2 = EndRead3dmChunk(this), bVar2)) {
          bVar2 = Read3dmV1AttributesOrMaterial
                            (this,(ON_3dmObjectAttributes *)0x0,&material,&bHaveMat,0xffffffff,
                             (ON__3dmV1_XDATA *)0x0);
          goto LAB_003d35fe;
        }
      }
      else {
        iVar5 = 0;
        if (local_194 == 0x100001) {
          lVar3 = (long)(this->m_chunk).m_count;
          pOVar4 = (this->m_chunk).m_a;
          if ((pOVar4 + lVar3 + -1 == (ON_3DM_BIG_CHUNK *)0x0 || lVar3 < 1) ||
             (pOVar4[lVar3 + -1].m_typecode != 0x100001)) {
            local_190 = 0;
            pOVar6 = (ON_3DM_BIG_CHUNK *)0x0;
          }
          else {
            local_190 = 0;
            pOVar6 = (ON_3DM_BIG_CHUNK *)0x0;
            if (pOVar4[lVar3 + -1].m_big_value == 0) {
              local_190 = this->m_current_positionX;
              pOVar6 = pOVar4 + lVar3 + -1;
            }
          }
          bVar2 = ReadPoint(this,&pt);
          iVar5 = -1;
          if (bVar2) {
            bVar2 = Read3dmV1AttributesOrMaterial
                              (this,(ON_3dmObjectAttributes *)0x0,&material,&bHaveMat,0xffffffff,
                               (ON__3dmV1_XDATA *)0x0);
            iVar5 = -(uint)!bVar2;
            if (bVar2 && pOVar6 != (ON_3DM_BIG_CHUNK *)0x0) {
              lVar3 = (long)(this->m_chunk).m_count;
              pOVar4 = (this->m_chunk).m_a + lVar3 + -1;
              if (lVar3 < 1) {
                pOVar4 = (ON_3DM_BIG_CHUNK *)0x0;
              }
              if (((pOVar6 == pOVar4) && (pOVar6->m_typecode == 0x100001)) &&
                 (pOVar6->m_big_value == 0)) {
                lVar3 = 0;
                if (local_190 <= this->m_current_positionX) {
                  lVar3 = this->m_current_positionX - local_190;
                }
                if (lVar3 - 0x20U < 0xfffffdf) {
                  pOVar6->m_big_value = lVar3;
                }
              }
            }
          }
        }
      }
    }
LAB_003d3603:
    uVar1 = this->m_error_message_mask;
    this->m_error_message_mask = uVar1 | 2;
    bVar2 = EndRead3dmChunk(this);
    this->m_error_message_mask = uVar1;
    if (!bVar2) goto LAB_003d36fb;
    if ((ppMaterial != (ON_Material **)0x0) && (bHaveMat != false)) {
      Internal_Increment3dmTableItemCount(this);
      this_00 = (ON_Material *)operator_new(0x138);
      ON_Material::ON_Material(this_00,&material);
      *ppMaterial = this_00;
      ON_ModelComponent::SetId((ON_ModelComponent *)this_00);
      iVar5 = 1;
LAB_003d3733:
      ON_Material::~ON_Material(&material);
      return iVar5;
    }
  } while( true );
}

Assistant:

int ON_BinaryArchive::Read3dmV1Material( ON_Material** ppMaterial )
{
  int rc = 0;
  // returns -1: failure
  //          0: end of material table
  //          1: success

  ON_Material material;
  ON__UINT32 tcode = 0;
  ON__INT64 big_value = 0;
  bool bHaveMat;
  bool bEndReadChunk_rc;
  // reads NURBS, point, and mesh objects

  while( 0 == rc )
  {
    bHaveMat = false;
    rc = 0;
    tcode = 0;
    big_value = 0;
    if ( !BeginRead3dmBigChunk(&tcode,&big_value) ) 
    {
      // assume we are at the end of the file
      break;
    }

    switch(tcode)
    {
    case TCODE_RH_POINT:
      // v1 3d point
      {
        ON_3DM_BIG_CHUNK* point_chunk = m_chunk.Last();
        ON__UINT64 pos0 = 0;
        if (    0 != point_chunk 
             && TCODE_RH_POINT == point_chunk->m_typecode 
             && 0 == point_chunk->m_big_value )
        {
          // Some V1 files have TCODE_RH_POINT chunks with length=0.
          // (It appears that points with arrow xdata have this problem.)
          // For these chunks we need to set the chunk length so EndRead3dmChunk()
          // will keep going.
          pos0 = CurrentPosition();
        }
        else
          point_chunk = 0;

        ON_3dPoint pt; // need to read point to get to material defn
        bool bOK = ReadPoint( pt );
        
        if ( bOK )
          bOK = Read3dmV1AttributesOrMaterial( nullptr, &material, bHaveMat, TCODE_ENDOFTABLE );
        
        if ( !bOK )
          rc = -1;
        // else if appropriate, rc will get set to +1 below.

        if ( bOK
             && 0 != point_chunk 
             && point_chunk == m_chunk.Last()
             && TCODE_RH_POINT == point_chunk->m_typecode 
             && 0 == point_chunk->m_big_value )
        {
          // set the chunk length so that reading can continue.
          ON__UINT64 pos1 = CurrentPosition();
          ON__UINT64 chunk_length = (pos1 > pos0) ? (pos1 - pos0) : 0;
          if ( chunk_length >= 32 && chunk_length < 0x0FFFFFFF )
            point_chunk->m_big_value = (ON__INT64)chunk_length;
        }
      }
      break;

    case TCODE_MESH_OBJECT:
      // v1 mesh
      {
        ON__UINT32 tc = 0;
        ON__INT64 i64 = 0;
        if ( !PeekAt3dmBigChunkType( &tc, &i64 ) )
          break;
        if ( tc != TCODE_COMPRESSED_MESH_GEOMETRY )
          break;
        // skip over the TCODE_COMPRESSED_MESH_GEOMETRY chunk
        if ( !BeginRead3dmBigChunk(&tc,&i64) )
          break;
        if ( !EndRead3dmChunk() )
          break;
        // attributes and material informtion follow the TCODE_COMPRESSED_MESH_GEOMETRY chunk
        if ( !Read3dmV1AttributesOrMaterial( nullptr, &material, bHaveMat, TCODE_ENDOFTABLE ) )
          rc = -1;
        // if appropriate, rc will get set to +1 below
      }
      break;

    case TCODE_LEGACY_SHL:
      // v1 polysurface
      if ( !Read3dmV1AttributesOrMaterial( nullptr, &material, bHaveMat, TCODE_LEGACY_SHLSTUFF ) )
        rc = -1;
        // if appropriate, rc will get set to +1 below
      break;
    case TCODE_LEGACY_FAC:
      // v1 trimmed surface
      if ( !Read3dmV1AttributesOrMaterial( nullptr, &material, bHaveMat, TCODE_LEGACY_FACSTUFF ) )
        rc = -1;
        // if appropriate, rc will get set to +1 below
      break;
    case TCODE_LEGACY_CRV:
      // v1 curve
      if ( !Read3dmV1AttributesOrMaterial( nullptr, &material, bHaveMat, TCODE_LEGACY_CRVSTUFF ) )
        rc = -1;
        // if appropriate, rc will get set to +1 below
      break;

    case TCODE_RHINOIO_OBJECT_NURBS_CURVE:
    case TCODE_RHINOIO_OBJECT_NURBS_SURFACE:
    case TCODE_RHINOIO_OBJECT_BREP:
      // old Rhino I/O toolkit nurbs curve, surface, and breps
      {
        ON__UINT32 tc = 0;
        ON__INT64 i64 = 0;
        if ( !PeekAt3dmBigChunkType( &tc, &i64 ) )
          break;
        if ( tc != TCODE_RHINOIO_OBJECT_DATA )
          break;
        // skip over the TCODE_RHINOIO_OBJECT_DATA chunk
        if ( !BeginRead3dmBigChunk(&tc,&i64) )
          break;
        if ( !EndRead3dmChunk() )
          break;
        if ( !Read3dmV1AttributesOrMaterial( nullptr, &material, bHaveMat, TCODE_RHINOIO_OBJECT_END ) )
          rc = -1;
        // if appropriate, rc will get set to +1 below
      }
      break;
    }

    const unsigned int saved_error_message_mask = m_error_message_mask;
    m_error_message_mask |= 0x02; // disable v1 EndRead3dmChunk() partially read chunk warning
    bEndReadChunk_rc = EndRead3dmChunk();
    m_error_message_mask = saved_error_message_mask; // enable v1 EndRead3dmChunk() partially read chunk warning
    if (!bEndReadChunk_rc ) 
    {
      rc = -1;
      break;
    }
    if ( bHaveMat && ppMaterial) 
    {
      Internal_Increment3dmTableItemCount();
      // found a valid non-default material
      *ppMaterial = new ON_Material(material);
      (*ppMaterial)->SetId(); // V1 materials did not have ids
      rc = 1;
      break;
    }
  }

  return rc;
}